

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

TestAllTypesLite * __thiscall
google::protobuf::Map<int,_proto2_unittest::TestAllTypesLite>::at<int>
          (Map<int,_proto2_unittest::TestAllTypesLite> *this,key_arg<int> *key)

{
  bool bVar1;
  LogMessage *pLVar2;
  pointer pvVar3;
  LogMessage local_60;
  Voidify local_49;
  const_iterator local_48;
  undefined1 local_30 [8];
  const_iterator it;
  key_arg<int> *key_local;
  Map<int,_proto2_unittest::TestAllTypesLite> *this_local;
  
  it.super_UntypedMapIterator._16_8_ = key;
  find<int>((const_iterator *)local_30,this,key);
  end(&local_48,this);
  bVar1 = protobuf::operator!=((const_iterator *)local_30,&local_48);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pvVar3 = const_iterator::operator->((const_iterator *)local_30);
    return &pvVar3->second;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_60,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/map.h"
             ,0x4e8,"it != end()");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [16])"key not found: ");
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (pLVar2,*(int *)it.super_UntypedMapIterator._16_8_);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_60);
}

Assistant:

const T& at(const key_arg<K>& key) const ABSL_ATTRIBUTE_LIFETIME_BOUND {
    const_iterator it = find(key);
    ABSL_CHECK(it != end()) << "key not found: " << static_cast<Key>(key);
    return it->second;
  }